

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreMetaBlockTrivial
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,Command *commands,size_t n_commands,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  HuffmanTree *tree;
  ulong uVar3;
  uint8_t dist_depth [64];
  uint16_t dist_bits [64];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  HistogramLiteral local_1fc8;
  uint8_t cmd_depth [704];
  uint16_t cmd_bits [704];
  HistogramDistance local_1370;
  HistogramCommand local_b40;
  
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  memset(&local_1fc8,0,0x408);
  local_1fc8.bit_cost_ = INFINITY;
  memset(&local_b40,0,0xb08);
  local_b40.bit_cost_ = INFINITY;
  memset(&local_1370,0,0x828);
  local_1370.bit_cost_ = INFINITY;
  BuildHistograms(input,start_pos,mask,commands,n_commands,&local_1fc8,&local_b40,&local_1370);
  uVar1 = *storage_ix;
  uVar3 = uVar1 >> 3;
  *(ulong *)(storage + uVar3) = (ulong)storage[uVar3];
  *storage_ix = uVar1 + 0xd;
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  BuildAndStoreHuffmanTree(local_1fc8.data_,0x100,tree,lit_depth,lit_bits,storage_ix,storage);
  BuildAndStoreHuffmanTree(local_b40.data_,0x2c0,tree,cmd_depth,cmd_bits,storage_ix,storage);
  BuildAndStoreHuffmanTree(local_1370.data_,0x40,tree,dist_depth,dist_bits,storage_ix,storage);
  BrotliFree(m,tree);
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,lit_depth,lit_bits,cmd_depth,cmd_bits,
             dist_depth,dist_bits,storage_ix,storage);
  if (is_last != 0) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreMetaBlockTrivial(MemoryManager* m,
                                 const uint8_t* input,
                                 size_t start_pos,
                                 size_t length,
                                 size_t mask,
                                 BROTLI_BOOL is_last,
                                 const Command *commands,
                                 size_t n_commands,
                                 size_t *storage_ix,
                                 uint8_t *storage) {
  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;
  uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
  uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
  uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS];
  uint16_t cmd_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t dist_depth[SIMPLE_DISTANCE_ALPHABET_SIZE];
  uint16_t dist_bits[SIMPLE_DISTANCE_ALPHABET_SIZE];
  HuffmanTree* tree;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramClearLiteral(&lit_histo);
  HistogramClearCommand(&cmd_histo);
  HistogramClearDistance(&dist_histo);

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  BrotliWriteBits(13, 0, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreHuffmanTree(lit_histo.data_, BROTLI_NUM_LITERAL_SYMBOLS, tree,
                           lit_depth, lit_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(cmd_histo.data_, BROTLI_NUM_COMMAND_SYMBOLS, tree,
                           cmd_depth, cmd_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(dist_histo.data_, SIMPLE_DISTANCE_ALPHABET_SIZE,
                           tree,
                           dist_depth, dist_bits,
                           storage_ix, storage);
  BROTLI_FREE(m, tree);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, lit_depth, lit_bits,
                            cmd_depth, cmd_bits,
                            dist_depth, dist_bits,
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}